

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_plt_tet_header(REF_GRID ref_grid,FILE *file)

{
  REF_MPI pRVar1;
  size_t sVar2;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  undefined4 local_b0;
  REF_STATUS ref_private_macro_code_rss;
  int aux;
  int celldim;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  undefined4 local_88;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  double solutiontime;
  undefined4 local_60;
  int strandid;
  int parentzone;
  float zonemarker;
  int ascii [8];
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->mpi;
  strandid = 0x43958000;
  local_60 = 0xffffffff;
  solutiontime._4_4_ = 0xffffffff;
  _zonetype = 0;
  datapacking = -1;
  faceneighbors = 0;
  numpts = 0;
  numelements = 0;
  ref_private_macro_code_rss = 0;
  local_b0 = 0;
  varloc = 4;
  ref_grid_local._4_4_ =
       ref_grid_compact_cell_nodes
                 (ref_grid,ref_grid->cell[8],(REF_GLOB *)&l2c,&nnode,(REF_GLOB **)&aux);
  if (ref_grid_local._4_4_ == 0) {
    if (((long)l2c < 1) || (nnode < 1)) {
      if (_aux != (REF_GLOB *)0x0) {
        free(_aux);
      }
      ref_grid_local._4_4_ = 0;
    }
    else if ((long)l2c < 0x80000000) {
      local_88 = SUB84(l2c,0);
      if (nnode < 0x80000000) {
        ncell._4_4_ = (undefined4)nnode;
        if (pRVar1->id == 0) {
          sVar2 = fwrite(&strandid,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xeca,"ref_gather_plt_tet_header","zonemarker",1,sVar2);
            return 1;
          }
          parentzone = 0x65;
          zonemarker = 7.28675e-44;
          ascii[0] = 0;
          sVar2 = fwrite(&parentzone,4,3,(FILE *)file);
          if (sVar2 != 3) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xecf,"ref_gather_plt_tet_header","title",3,sVar2);
            return 1;
          }
          sVar2 = fwrite(&local_60,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed1,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite((void *)((long)&solutiontime + 4),4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed2,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&zonetype,8,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed3,"ref_gather_plt_tet_header","double",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&datapacking,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed4,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&varloc,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed5,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&faceneighbors,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed6,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&numpts,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed7,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&numelements,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed8,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&local_88,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xed9,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite((void *)((long)&ncell + 4),4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xeda,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xedb,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xedc,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&ref_private_macro_code_rss,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xedd,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
          sVar2 = fwrite(&local_b0,4,1,(FILE *)file);
          if (sVar2 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xede,"ref_gather_plt_tet_header","int",1,sVar2);
            return 1;
          }
        }
        if (_aux != (REF_GLOB *)0x0) {
          free(_aux);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xec6,"ref_gather_plt_tet_header","too many tets for int");
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xec4,"ref_gather_plt_tet_header","too many nodes for int");
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xebe,
           "ref_gather_plt_tet_header",(ulong)ref_grid_local._4_4_,"l2c");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_tet_header(REF_GRID ref_grid,
                                                    FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  int ascii[8];
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 4; /*4=FETETRAHEDRON*/

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many tets for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    ascii[0] = (int)'e';
    ascii[1] = (int)'4';
    ascii[2] = 0;
    REIS(3, fwrite(&ascii, sizeof(int), 3, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}